

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

void __thiscall cmQtAutoMocUic::MocSettingsT::MocSettingsT(MocSettingsT *this)

{
  MocSettingsT *this_local;
  
  this->Enabled = false;
  this->SettingsChanged = false;
  this->RelaxedMode = false;
  cmFileTime::cmFileTime(&this->ExecutableTime);
  std::__cxx11::string::string((string *)&this->Executable);
  std::__cxx11::string::string((string *)&this->CompFileAbs);
  std::__cxx11::string::string((string *)&this->PredefsFileRel);
  std::__cxx11::string::string((string *)&this->PredefsFileAbs);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->SkipList);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Includes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Definitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Options);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->AllOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->PredefsCmd);
  std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>::vector
            (&this->DependFilters);
  std::vector<cmQtAutoMocUic::KeyExpT,_std::allocator<cmQtAutoMocUic::KeyExpT>_>::vector
            (&this->MacroFilters);
  cmsys::RegularExpression::RegularExpression(&this->RegExpInclude);
  cmsys::RegularExpression::compile
            (&this->RegExpInclude,
             "(^|\n)[ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  return;
}

Assistant:

cmQtAutoMocUic::MocSettingsT::MocSettingsT()
{
  RegExpInclude.compile(
    "(^|\n)[ \t]*#[ \t]*include[ \t]+"
    "[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]");
}